

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_function_impl.h
# Opt level: O2

void __thiscall
dlib::any_function<void_(),_void,_0UL>::derived<dlib::impl::image_display_functor,_void_()>::
~derived(derived<dlib::impl::image_display_functor,_void_()> *this)

{
  (this->super_base)._vptr_Tbase = (_func_int **)&PTR__derived_00338fa8;
  impl::image_display_functor::~image_display_functor(&this->item);
  return;
}

Assistant:

DLIB_ANY_FUNCTION_DERIVED_BOILERPLATE

    virtual result_type evaluate (
    ) const { DLIB_ANY_FUNCTION_RETURN item(); }